

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

bool __thiscall llvm::detail::IEEEFloat::isLargest(IEEEFloat *this)

{
  Significand *pSVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  Significand *pSVar6;
  
  if (((this->field_0x12 & 7) != 3 && (this->field_0x12 & 6) != 0) &&
     (this->exponent == this->semantics->maxExponent)) {
    uVar2 = this->semantics->precision;
    if (uVar2 - 0x40 < 0xffffff80) {
      pSVar6 = (Significand *)(this->significand).parts;
    }
    else {
      pSVar6 = &this->significand;
    }
    uVar4 = (ulong)((uVar2 + 0x40 >> 6) - 1);
    uVar5 = 0;
    do {
      if (uVar4 == uVar5) {
        iVar3 = (uVar2 + 0x40 & 0xffffffc0) - uVar2;
        if (iVar3 + 1U < 0x41) {
          return (-1L << (~(byte)iVar3 & 0x3f) | pSVar6[uVar4].part) == 0xffffffffffffffff;
        }
        __assert_fail("NumHighBits <= integerPartWidth && \"Can not have more high bits to \" \"fill than integerPartWidth\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x314,"bool llvm::detail::IEEEFloat::isSignificandAllOnes() const");
      }
      pSVar1 = pSVar6 + uVar5;
      uVar5 = uVar5 + 1;
    } while (pSVar1->part == 0xffffffffffffffff);
    return false;
  }
  return false;
}

Assistant:

bool isNaN() const { return category == fcNaN; }